

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,false,true>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  ushort *puVar14;
  ulong uVar15;
  unsigned_short *puVar16;
  unsigned_short *puVar17;
  ulong uVar18;
  ulong uVar19;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  idx_t local_90;
  _Head_base<0UL,_unsigned_long_*,_false> local_88;
  ushort *local_80;
  ValidityMask *local_78;
  unsigned_short *local_70;
  unsigned_short *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  ulong local_50;
  unsigned_short *local_48;
  unsigned_short *local_40;
  ulong local_38;
  
  _Var13._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_80 = rdata;
  local_70 = ldata;
  local_68 = result_data;
  if (_Var13._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = *rdata;
      _Var13._M_head_impl = (unsigned_long *)0x0;
      uVar12 = 0;
      do {
        uVar8 = ldata[uVar12];
        if (uVar9 == 0) {
          if (_Var13._M_head_impl == (unsigned_long *)0x0) {
            local_88._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_88);
            p_Var5 = p_Stack_a0;
            peVar4 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var13._M_head_impl =
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var13._M_head_impl;
            ldata = local_70;
            result_data = local_68;
          }
          bVar3 = (byte)uVar12 & 0x3f;
          _Var13._M_head_impl[uVar12 >> 6] =
               _Var13._M_head_impl[uVar12 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          uVar8 = uVar8 % uVar9;
        }
        result_data[uVar12] = uVar8;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar18 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_60 = 0;
    uVar12 = 0;
    local_90 = count;
    local_78 = mask;
    local_50 = uVar18;
    do {
      if (_Var13._M_head_impl == (unsigned_long *)0x0) {
        uVar10 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar10 = count;
        }
LAB_014acabe:
        uVar11 = uVar12;
        if (uVar12 < uVar10) {
          uVar9 = *local_80;
          do {
            uVar8 = ldata[uVar12];
            if (uVar9 == 0) {
              if (_Var13._M_head_impl == (unsigned_long *)0x0) {
                local_88._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,(unsigned_long *)&local_88);
                p_Var5 = p_Stack_a0;
                peVar4 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_58);
                _Var13._M_head_impl =
                     (pTVar7->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var13._M_head_impl;
                ldata = local_70;
                result_data = local_68;
              }
              bVar3 = (byte)uVar12 & 0x3f;
              _Var13._M_head_impl[uVar12 >> 6] =
                   _Var13._M_head_impl[uVar12 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
            }
            else {
              uVar8 = uVar8 % uVar9;
            }
            result_data[uVar12] = uVar8;
            uVar12 = uVar12 + 1;
            uVar11 = uVar10;
            count = local_90;
          } while (uVar10 != uVar12);
        }
      }
      else {
        uVar1 = _Var13._M_head_impl[local_60];
        uVar10 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar10 = count;
        }
        uVar11 = uVar10;
        count = local_90;
        if (uVar1 != 0) {
          if (uVar1 == 0xffffffffffffffff) goto LAB_014acabe;
          uVar15 = uVar10 - uVar12;
          uVar11 = uVar12;
          mask = local_78;
          if (uVar12 <= uVar10 && uVar15 != 0) {
            puVar16 = result_data + uVar12;
            puVar17 = ldata + uVar12;
            uVar19 = 0;
            puVar14 = local_80;
            local_48 = puVar17;
            local_40 = puVar16;
            local_38 = uVar15;
            do {
              pVVar6 = local_78;
              if ((uVar1 >> (uVar19 & 0x3f) & 1) != 0) {
                uVar9 = puVar17[uVar19];
                if (*puVar14 == 0) {
                  if (_Var13._M_head_impl == (unsigned_long *)0x0) {
                    local_88._M_head_impl =
                         (unsigned_long *)
                         (local_78->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,(unsigned_long *)&local_88);
                    p_Var5 = p_Stack_a0;
                    peVar4 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar4;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var5;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    _Var13._M_head_impl =
                         (pTVar7->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_78->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var13._M_head_impl;
                    ldata = local_70;
                    result_data = local_68;
                    puVar14 = local_80;
                    uVar15 = local_38;
                    puVar16 = local_40;
                    puVar17 = local_48;
                  }
                  bVar3 = (byte)(uVar12 + uVar19) & 0x3f;
                  _Var13._M_head_impl[uVar12 + uVar19 >> 6] =
                       _Var13._M_head_impl[uVar12 + uVar19 >> 6] &
                       (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                }
                else {
                  uVar9 = uVar9 % *puVar14;
                }
                puVar16[uVar19] = uVar9;
              }
              uVar19 = uVar19 + 1;
              uVar11 = uVar10;
              mask = local_78;
              uVar18 = local_50;
              count = local_90;
            } while (uVar15 != uVar19);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar12 = uVar11;
    } while (local_60 != uVar18);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}